

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O3

BOOL __thiscall
Js::TypedArray<double,_false,_false>::DirectSetItemAtRange
          (TypedArray<double,_false,_false> *this,TypedArray<double,_false,_false> *fromArray,
          int32 iSrcStart,int32 iDstStart,uint32 length,_func_double_Var_ScriptContext_ptr *convFunc
          )

{
  uint uVar1;
  Type puVar2;
  Type puVar3;
  JavascriptLibrary *pJVar4;
  code *pcVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  undefined4 *puVar8;
  ulong uVar9;
  uint32 uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  puVar2 = (this->super_TypedArrayBase).buffer;
  puVar3 = (fromArray->super_TypedArrayBase).buffer;
  if (puVar3 == (Type)0x0 || puVar2 == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x156,"(srcBuffer && dstBuffer)","srcBuffer && dstBuffer");
    if (!bVar7) goto LAB_00ac76b6;
    *puVar8 = 0;
  }
  if (0xfffffff < length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x157,
                                "(length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName))",
                                "length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName)");
    if (!bVar7) goto LAB_00ac76b6;
    *puVar8 = 0;
  }
  if (iSrcStart != iDstStart) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x159,"(iSrcStart == iDstStart)","iSrcStart == iDstStart");
    if (!bVar7) goto LAB_00ac76b6;
    *puVar8 = 0;
  }
  if ((((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached != false)
     || (((fromArray->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached ==
         true)) {
    JavascriptError::ThrowTypeError
              ((((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                   super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
  }
  if (iDstStart < 0) {
    if ((long)((long)iDstStart + (ulong)length) < 0) {
      return 1;
    }
    uVar10 = length + iDstStart;
    uVar14 = 0;
  }
  else {
    uVar10 = length;
    uVar14 = iDstStart;
    if (CARRY4(length,iDstStart)) {
      ::Math::DefaultOverflowPolicy();
    }
  }
  uVar1 = (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
  uVar12 = uVar1 - uVar14;
  if (uVar1 < uVar14) {
    uVar12 = 0;
  }
  if (length + iDstStart < uVar1) {
    uVar12 = uVar10;
  }
  uVar1 = (fromArray->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
  uVar13 = uVar1 - uVar14;
  if (uVar1 < uVar14) {
    uVar13 = 0;
  }
  if (length + iDstStart < uVar1) {
    uVar13 = uVar10;
  }
  if (uVar10 < uVar13) {
    uVar13 = uVar10;
  }
  uVar1 = uVar12;
  if (uVar13 < uVar12) {
    uVar1 = uVar13;
  }
  uVar11 = (ulong)uVar1;
  if (uVar11 * 8 < uVar11) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x175,"(byteSize >= length)","byteSize >= length");
    if (!bVar7) {
LAB_00ac76b6:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  js_memcpy_s(puVar2 + (ulong)uVar14 * 8,(ulong)uVar12 * 8,puVar3 + (ulong)uVar14 * 8,uVar11 * 8);
  if (uVar13 < uVar12) {
    pJVar4 = (((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
               super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr;
    dVar17 = (*convFunc)((pJVar4->super_JavascriptLibraryBase).undefinedValue.ptr,
                         (pJVar4->super_JavascriptLibraryBase).scriptContext.ptr);
    auVar6 = _DAT_00fa8550;
    lVar15 = uVar12 - uVar11;
    lVar16 = lVar15 + -1;
    auVar18._8_4_ = (int)lVar16;
    auVar18._0_8_ = lVar16;
    auVar18._12_4_ = (int)((ulong)lVar16 >> 0x20);
    uVar9 = 0;
    auVar19 = pmovsxbq(in_XMM2,0x100);
    auVar18 = auVar18 ^ _DAT_00fa8550;
    do {
      if ((bool)(~(auVar18._0_8_ < (long)(uVar9 ^ auVar6._0_8_)) & 1)) {
        *(double *)(puVar2 + uVar9 * 8 + uVar11 * 8) = dVar17;
      }
      auVar20._8_4_ = (int)uVar9;
      auVar20._0_8_ = uVar9;
      auVar20._12_4_ = (int)(uVar9 >> 0x20);
      if ((long)((auVar20._8_8_ | auVar19._8_8_) ^ auVar6._8_8_) <= auVar18._8_8_) {
        *(double *)(puVar2 + uVar9 * 8 + uVar11 * 8 + 8) = dVar17;
      }
      uVar9 = uVar9 + 2;
    } while ((lVar15 + 1U & 0xfffffffffffffffe) != uVar9);
  }
  return 1;
}

Assistant:

inline BOOL DirectSetItemAtRange(TypedArray *fromArray, __in int32 iSrcStart, __in int32 iDstStart, __in uint32 length, TypeName(*convFunc)(Var value, ScriptContext* scriptContext))
        {
            TypeName* dstBuffer = (TypeName*)buffer;
            TypeName* srcBuffer = (TypeName*)fromArray->buffer;
            Assert(srcBuffer && dstBuffer);
            Assert(length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName));
            // caller checks that src and dst index are the same
            Assert(iSrcStart == iDstStart);

            if (this->IsDetachedBuffer() || fromArray->IsDetachedBuffer())
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }

            // Fixup destination start in case it's negative
            uint32 start = iDstStart;
            if (iDstStart < 0)
            {
                if ((int64)(length) + iDstStart < 0)
                {
                    // nothing to do, all index are no-op
                    return true;
                }

                length += iDstStart;
                start = 0;
            }

            uint32 dstLength = UInt32Math::Add(start, length) < GetLength() ? length : GetLength() > start ? GetLength() - start : 0;
            uint32 srcLength = start + length < fromArray->GetLength() ? length : (fromArray->GetLength() > start ? fromArray->GetLength() - start : 0);

            // length is the minimum of length, srcLength and dstLength
            length = length < srcLength ? (length < dstLength ? length : dstLength) : (srcLength < dstLength ? srcLength : dstLength);

            const size_t byteSize = sizeof(TypeName) * length;
            Assert(byteSize >= length); // check for overflow
            js_memcpy_s(dstBuffer + start, dstLength * sizeof(TypeName), srcBuffer + start, byteSize);

            if (dstLength > length)
            {
                TypeName undefinedValue = convFunc(GetLibrary()->GetUndefined(), GetScriptContext());
                for (uint32 i = length; i < dstLength; i++)
                {
                    dstBuffer[i] = undefinedValue;
                }
            }

            return true;
        }